

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

cio_error bs_write_ok(cio_buffered_stream *buffered_stream,cio_write_buffer *buf,
                     cio_buffered_stream_write_handler_t handler,void *handler_context)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (buf->data).head.q_len;
  sVar4 = write_buffer_pos;
  if (uVar1 != 0) {
    uVar3 = 1;
    do {
      buf = buf->next;
      memcpy(write_buffer + sVar4,(buf->data).element.field_0.const_data,(buf->data).element.length)
      ;
      sVar4 = sVar4 + (buf->data).element.length;
      bVar2 = uVar3 < uVar1;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar2);
  }
  write_buffer_pos = sVar4;
  (*handler)(buffered_stream,handler_context,CIO_SUCCESS);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error bs_write_ok(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buf, cio_buffered_stream_write_handler_t handler, void *handler_context)
{
	size_t len = cio_write_buffer_get_num_buffer_elements(buf);
	for (unsigned int i = 0; i < len; i++) {
		buf = buf->next;
		memcpy(&write_buffer[write_buffer_pos], buf->data.element.data, buf->data.element.length);
		write_buffer_pos += buf->data.element.length;
	}

	handler(buffered_stream, handler_context, CIO_SUCCESS);
	return CIO_SUCCESS;
}